

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O3

void __thiscall HV_Edit_Buffer::check(HV_Edit_Buffer *this,int size)

{
  char *pcVar1;
  uint uVar2;
  
  if (this->allocated_ <= this->size_ + size) {
    uVar2 = -this->extend_ & this->allocated_ + size + this->extend_;
    pcVar1 = (char *)realloc(this->buf_,(long)(int)uVar2);
    this->buf_ = pcVar1;
    this->allocated_ = uVar2;
  }
  return;
}

Assistant:

void HV_Edit_Buffer::check(int size) {

  if (size_ + size + 1 <= allocated_) return;

  int new_size = (allocated_ + size + extend_) & (~(extend_-1)); // round to chunk size

  buf_ = (char *)realloc(buf_, new_size);

#if (DEBUG_EDIT_BUFFER)
  printf("HV_Edit_Buffer::check(%d), allocated: %d ->%d\n",
	 size, allocated_, new_size);
  fflush(stdout);
#endif

  allocated_ = new_size;

}